

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Class.cpp
# Opt level: O1

void __thiscall hdc::Class::addVariable(Class *this,ClassVariable *variable)

{
  pointer *pppCVar1;
  int value;
  iterator __position;
  ClassVariable *local_10;
  
  value = this->classVariableCounter;
  this->classVariableCounter = value + 1;
  local_10 = variable;
  Variable::setLocalName(&variable->super_Variable,value);
  __position._M_current =
       (this->variables).
       super__Vector_base<hdc::ClassVariable_*,_std::allocator<hdc::ClassVariable_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->variables).
      super__Vector_base<hdc::ClassVariable_*,_std::allocator<hdc::ClassVariable_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<hdc::ClassVariable*,std::allocator<hdc::ClassVariable*>>::
    _M_realloc_insert<hdc::ClassVariable*const&>
              ((vector<hdc::ClassVariable*,std::allocator<hdc::ClassVariable*>> *)&this->variables,
               __position,&local_10);
  }
  else {
    *__position._M_current = local_10;
    pppCVar1 = &(this->variables).
                super__Vector_base<hdc::ClassVariable_*,_std::allocator<hdc::ClassVariable_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppCVar1 = *pppCVar1 + 1;
  }
  return;
}

Assistant:

void Class::addVariable(ClassVariable* variable) {
    variable->setLocalName(classVariableCounter++);
    variables.push_back(variable);
}